

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O0

void __thiscall
Alice::ObliviousTranslate
          (Alice *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_P,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_D)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  long lVar4;
  ostream *poVar5;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  *pvVar6;
  int local_98;
  int local_94;
  int j;
  int i_1;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_78;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_60;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> local_48;
  int local_30;
  int i;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *local_20;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_D_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *Perm_P_local;
  Alice *this_local;
  
  local_20 = Perm_D;
  Perm_D_local = Perm_P;
  Perm_P_local = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)this;
  if (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
      ::fout == '\0') {
    iVar1 = __cxa_guard_acquire(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                                 ::fout);
    if (iVar1 != 0) {
      std::ofstream::ofstream
                (ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                 ::fout,"../debug/alice/DebugTranslate_A.txt",0x10);
      __cxa_atexit(std::ofstream::~ofstream,
                   ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                   ::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                           ::fout);
    }
  }
  for (local_30 = 0; local_30 < (this->super_Party).n_p; local_30 = local_30 + 1) {
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).P,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,0);
    lVar4 = *pvVar3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              (&local_48,Perm_D);
    lVar4 = ObliviousTranslateSingleAddress(this,lVar4,&local_48);
    pvVar6 = &(this->super_Party).P;
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,0);
    *pvVar3 = lVar4;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector(&local_48);
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,1);
    lVar4 = *pvVar3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              (&local_60,Perm_D);
    lVar4 = ObliviousTranslateSingleAddress(this,lVar4,&local_60);
    pvVar6 = &(this->super_Party).P;
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,1);
    *pvVar3 = lVar4;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector(&local_60);
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,2);
    lVar4 = *pvVar3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              (&local_78,Perm_P);
    lVar4 = ObliviousTranslateSingleAddress(this,lVar4,&local_78);
    pvVar6 = &(this->super_Party).P;
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,2);
    *pvVar3 = lVar4;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector(&local_78);
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](pvVar6,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,3);
    lVar4 = *pvVar3;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&j,Perm_P);
    lVar4 = ObliviousTranslateSingleAddress
                      (this,lVar4,
                       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&j)
    ;
    pvVar2 = std::
             vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ::operator[](&(this->super_Party).P,(long)local_30);
    pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,3);
    *pvVar3 = lVar4;
    std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
              ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)&j);
  }
  poVar5 = std::operator<<((ostream *)
                           ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                           ::fout,"Translation # ");
  iVar1 = ObliviousTranslate::count;
  ObliviousTranslate::count = ObliviousTranslate::count + 1;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar1);
  std::operator<<(poVar5,"\n");
  for (local_94 = 0; local_94 < (this->super_Party).n_p; local_94 = local_94 + 1) {
    for (local_98 = 0; local_98 < 5; local_98 = local_98 + 1) {
      pvVar2 = std::
               vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               ::operator[](&(this->super_Party).P,(long)local_94);
      pvVar3 = std::vector<long,_std::allocator<long>_>::operator[](pvVar2,(long)local_98);
      poVar5 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)
                          ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                          ::fout,*pvVar3);
      std::operator<<(poVar5," ");
    }
    std::operator<<((ostream *)
                    ObliviousTranslate(std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>,std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>)
                    ::fout,"\n");
  }
  return;
}

Assistant:

void Alice::ObliviousTranslate(std::vector<std::pair<long,long>> Perm_P, std::vector<std::pair<long,long>>Perm_D)
{
    static int count=0;
    static std::ofstream fout("../debug/alice/DebugTranslate_A.txt");
    for(int i = 0; i < n_p; i++)
    {
        P[i][0] = ObliviousTranslateSingleAddress(P[i][0], Perm_D);
        P[i][1] = ObliviousTranslateSingleAddress(P[i][1], Perm_D);
        P[i][2] = ObliviousTranslateSingleAddress(P[i][2], Perm_P);
        P[i][3] = ObliviousTranslateSingleAddress(P[i][3], Perm_P);
    }
    fout<<"Translation # "<<count++<<"\n";
    for(int i=0; i<n_p; i++)
    {
        for(int j=0; j<5; j++)
            fout<<P[i][j]<<" ";
        fout<<"\n";
    }    

}